

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O2

uint2048 * from_issue_339::modInverse(uint2048 A,uint2048 M)

{
  enable_if_t<std::is_integral<int>::value,_bool> eVar1;
  uintwide_t<2048U,_unsigned_int,_void,_false> *in_RDI;
  uint4096 q;
  uint4096 x;
  uint4096 y;
  uint4096 m0;
  uintwide_t<4096U,_unsigned_int,_void,_false> local_630;
  uintwide_t<4096U,_unsigned_int,_void,_false> local_430;
  uint4096 t;
  
  math::wide_integer::uintwide_t::operator_cast_to_uintwide_t(&m0,(uintwide_t *)&M);
  math::wide_integer::uintwide_t<4096U,_unsigned_int,_void,_false>::uintwide_t<int>
            (&y,0,(enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  math::wide_integer::uintwide_t<4096U,_unsigned_int,_void,_false>::uintwide_t<int>
            (&x,1,(enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  q.values.super_array<unsigned_int,_128UL>.elems[0] = 1;
  eVar1 = math::wide_integer::operator==
                    ((uintwide_t<2048U,_unsigned_int,_void,_false> *)&M,(int *)&q);
  if (eVar1) {
    math::wide_integer::uintwide_t<2048U,_unsigned_int,_void,_false>::uintwide_t<int>
              (in_RDI,0,(enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *
                        )0x0);
  }
  else {
    while( true ) {
      q.values.super_array<unsigned_int,_128UL>.elems[0] = 1;
      eVar1 = math::wide_integer::operator>(&A,(int *)&q);
      if (!eVar1) break;
      math::wide_integer::operator/
                ((uintwide_t<2048U,_unsigned_int,_void,_false> *)&t,&A,
                 (uintwide_t<2048U,_unsigned_int,_void,_false> *)&M);
      math::wide_integer::uintwide_t::operator_cast_to_uintwide_t(&q,(uintwide_t *)&t);
      math::wide_integer::uintwide_t::operator_cast_to_uintwide_t
                ((uintwide_t<4096U,_unsigned_int,_void,_false> *)&t,(uintwide_t *)&M);
      math::wide_integer::operator%
                ((uintwide_t<2048U,_unsigned_int,_void,_false> *)&local_430,&A,
                 (uintwide_t<2048U,_unsigned_int,_void,_false> *)&M);
      memcpy((uintwide_t *)&M,&local_430,0x100);
      math::wide_integer::uintwide_t::operator_cast_to_uintwide_t
                ((uintwide_t<2048U,_unsigned_int,_void,_false> *)&local_430,(uintwide_t *)&t);
      memcpy(&A,&local_430,0x100);
      memcpy((uintwide_t *)&t,&y,0x200);
      math::wide_integer::operator*(&local_630,&q,&y);
      math::wide_integer::operator-(&local_430,&x,&local_630);
      memcpy(&y,&local_430,0x200);
      memcpy(&x,(uintwide_t *)&t,0x200);
    }
    q.values.super_array<unsigned_int,_128UL>.elems[0] = 0;
    eVar1 = math::wide_integer::operator<(&x,(int *)&q);
    if (eVar1) {
      math::wide_integer::uintwide_t<4096U,_unsigned_int,_void,_false>::operator+=(&x,&m0);
    }
    math::wide_integer::uintwide_t::operator_cast_to_uintwide_t(in_RDI,(uintwide_t *)&x);
  }
  return in_RDI;
}

Assistant:

auto modInverse(uint2048 A, uint2048 M) -> uint2048 // NOLINT(readability-identifier-naming)
  {
    uint4096 m0 = M;
    uint4096 y  = 0;
    uint4096 x  = 1;

    if(M == 1)
    {
      return 0; // LCOV_EXCL_LINE
    }

    while (A > 1)
    {
      uint4096 q = A / M;
      uint4096 t = M;

      M = A % M;
      A = t;
      t = y;

      y = x - q * y;
      x = t;
    }

    if (x < 0)
    {
      x += m0; // LCOV_EXCL_LINE
    }

    return x;
  }